

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QNameDatatypeValidator.cpp
# Opt level: O2

void __thiscall
xercesc_4_0::QNameDatatypeValidator::checkContent
          (QNameDatatypeValidator *this,XMLCh *content,ValidationContext *context,bool asBase,
          MemoryManager *manager)

{
  uint uVar1;
  DatatypeValidator *pDVar2;
  RefArrayVectorOf<char16_t> *pRVar3;
  ulong uVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  uint uVar8;
  int iVar9;
  char16_t *pcVar10;
  XMLCh *toDelete;
  undefined4 extraout_var;
  InvalidDatatypeValueException *pIVar11;
  XMLCh *str1;
  ulong getAt;
  XMLCh *local_80;
  XMLCh *local_70;
  ArrayJanitor<char16_t> jan;
  ArrayJanitor<char16_t> janEnum;
  
  pDVar2 = (this->super_AbstractStringValidator).super_DatatypeValidator.fBaseValidator;
  if (pDVar2 != (DatatypeValidator *)0x0) {
    (*(pDVar2->super_XSerializable)._vptr_XSerializable[0x14])(pDVar2,content,context,1,manager);
  }
  uVar1 = (this->super_AbstractStringValidator).super_DatatypeValidator.fFacetsDefined;
  if ((uVar1 & 8) != 0) {
    bVar5 = RegularExpression::matches
                      ((this->super_AbstractStringValidator).super_DatatypeValidator.fRegex,content,
                       manager);
    if (!bVar5) {
      pIVar11 = (InvalidDatatypeValueException *)__cxa_allocate_exception(0x30);
      InvalidDatatypeValueException::InvalidDatatypeValueException
                (pIVar11,
                 "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/validators/datatype/QNameDatatypeValidator.cpp"
                 ,0x6c,VALUE_NotMatch_Pattern,content,
                 (this->super_AbstractStringValidator).super_DatatypeValidator.fPattern,(XMLCh *)0x0
                 ,(XMLCh *)0x0,manager);
      __cxa_throw(pIVar11,&InvalidDatatypeValueException::typeinfo,XMLException::~XMLException);
    }
  }
  if (!asBase) {
    (*(this->super_AbstractStringValidator).super_DatatypeValidator.super_XSerializable.
      _vptr_XSerializable[0x11])(this,content,manager);
    uVar8 = 0;
    ArrayJanitor<char16_t>::ArrayJanitor(&jan,(char16_t *)0x0,manager);
    local_80 = (XMLCh *)0x0;
    if (context != (ValidationContext *)0x0) {
      local_80 = XMLString::replicate(content,manager);
      ArrayJanitor<char16_t>::reset(&jan,local_80,manager);
      (*(this->super_AbstractStringValidator).super_DatatypeValidator.super_XSerializable.
        _vptr_XSerializable[0x16])(this,local_80,manager);
      uVar8 = XMLString::indexOf(content,L':');
      if (0 < (int)uVar8) {
        local_80[uVar8] = L'\0';
        iVar9 = (*context->_vptr_ValidationContext[0xd])();
        if ((char)iVar9 != '\0') {
          pIVar11 = (InvalidDatatypeValueException *)__cxa_allocate_exception(0x30);
          InvalidDatatypeValueException::InvalidDatatypeValueException
                    (pIVar11,
                     "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/validators/datatype/QNameDatatypeValidator.cpp"
                     ,0x87,VALUE_QName_Invalid2,content,(XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0,
                     manager);
          __cxa_throw(pIVar11,&InvalidDatatypeValueException::typeinfo,XMLException::~XMLException);
        }
      }
    }
    if (((uVar1 & 0x10) != 0) &&
       (pRVar3 = (this->super_AbstractStringValidator).fEnumeration,
       pRVar3 != (RefArrayVectorOf<char16_t> *)0x0 && context != (ValidationContext *)0x0)) {
      str1 = local_80 + (ulong)uVar8 + 1;
      if ((int)uVar8 < 1) {
        str1 = local_80;
      }
      uVar4 = (pRVar3->super_BaseRefVectorOf<char16_t>).fCurCount;
      bVar5 = false;
      local_70 = (XMLCh *)0x0;
      for (getAt = 0; getAt < uVar4; getAt = getAt + 2) {
        pcVar10 = BaseRefVectorOf<char16_t>::elementAt
                            (&((this->super_AbstractStringValidator).fEnumeration)->
                              super_BaseRefVectorOf<char16_t>,getAt);
        toDelete = XMLString::replicate(pcVar10,manager);
        ArrayJanitor<char16_t>::ArrayJanitor(&janEnum,toDelete,manager);
        iVar9 = XMLString::indexOf(toDelete,L':',0,manager);
        if (iVar9 != -1) {
          toDelete[iVar9] = L'\0';
          toDelete = toDelete + (long)iVar9 + 1;
        }
        bVar6 = XMLString::equals(str1,toDelete);
        bVar7 = true;
        if (bVar6) {
          if (iVar9 < 0) {
            bVar7 = false;
          }
          else {
            if (!bVar5) {
              iVar9 = (*context->_vptr_ValidationContext[0xf])(context,local_80);
              local_70 = (XMLCh *)CONCAT44(extraout_var,iVar9);
            }
            pcVar10 = BaseRefVectorOf<char16_t>::elementAt
                                (&((this->super_AbstractStringValidator).fEnumeration)->
                                  super_BaseRefVectorOf<char16_t>,getAt + 1);
            bVar7 = XMLString::equals(local_70,pcVar10);
            bVar7 = !bVar7;
            bVar5 = true;
          }
        }
        ArrayJanitor<char16_t>::~ArrayJanitor(&janEnum);
        if (!bVar7) break;
      }
      if (uVar4 == getAt) {
        pIVar11 = (InvalidDatatypeValueException *)__cxa_allocate_exception(0x30);
        InvalidDatatypeValueException::InvalidDatatypeValueException
                  (pIVar11,
                   "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/validators/datatype/QNameDatatypeValidator.cpp"
                   ,0xd2,VALUE_NotIn_Enumeration,content,(XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0,
                   manager);
        __cxa_throw(pIVar11,&InvalidDatatypeValueException::typeinfo,XMLException::~XMLException);
      }
    }
    (*(this->super_AbstractStringValidator).super_DatatypeValidator.super_XSerializable.
      _vptr_XSerializable[0xf])(this,content,manager);
    ArrayJanitor<char16_t>::~ArrayJanitor(&jan);
  }
  return;
}

Assistant:

void QNameDatatypeValidator::checkContent( const XMLCh*             const content
                                          ,       ValidationContext* const context
                                          ,       bool                     asBase
                                          ,       MemoryManager*     const manager
                                          )
{

    //validate against base validator if any
    QNameDatatypeValidator *pBaseValidator = (QNameDatatypeValidator*) this->getBaseValidator();
    if (pBaseValidator)
        pBaseValidator->checkContent(content, context, true, manager);

    int thisFacetsDefined = getFacetsDefined();

    // we check pattern first
    if ( (thisFacetsDefined & DatatypeValidator::FACET_PATTERN ) != 0 )
    {
        if (getRegex()->matches(content, manager) ==false)
        {
            ThrowXMLwithMemMgr2(InvalidDatatypeValueException
                    , XMLExcepts::VALUE_NotMatch_Pattern
                    , content
                    , getPattern()
                    , manager);
        }
    }

    // if this is a base validator, we only need to check pattern facet
    // all other facet were inherited by the derived type
    if (asBase)
        return;

    checkValueSpace(content, manager);

    int colonPos = 0;
    XMLCh* prefix = 0;    
    ArrayJanitor<XMLCh>  jan(prefix, manager);

    if (context) {
        prefix = XMLString::replicate(content, manager);
        jan.reset(prefix, manager);
        normalizeContent(prefix, manager);

        colonPos = XMLString::indexOf(content, chColon);
        if (colonPos > 0) {                        
            prefix[colonPos] = chNull;                     
            if (context->isPrefixUnknown(prefix)) {
                ThrowXMLwithMemMgr1(InvalidDatatypeValueException
                    , XMLExcepts::VALUE_QName_Invalid2
                    , content
                    , manager);             
            }                                  
        }
    }

#if 0
    if ((thisFacetsDefined & DatatypeValidator::FACET_ENUMERATION) != 0 &&
        (getEnumeration() != 0))
    {
        XMLCh* normContent = XMLString::replicate(content, manager);
        ArrayJanitor<XMLCh>  jan(normContent, manager);
        normalizeContent(normContent, manager);

        int i=0;
        int enumLength = getEnumeration()->size();
        for ( ; i < enumLength; i++)
        {
            if (XMLString::equals(normContent, getEnumeration()->elementAt(i)))
                break;
        }

        if (i == enumLength)
            ThrowXMLwithMemMgr1(InvalidDatatypeValueException, XMLExcepts::VALUE_NotIn_Enumeration, content, manager);
    }


#else
    if ((thisFacetsDefined & DatatypeValidator::FACET_ENUMERATION) != 0 &&
        (getEnumeration() != 0) && context)
    {
        XMLCh* localName;
        if (colonPos > 0) {
            localName = prefix + colonPos + 1;
        }
        else {
            localName = prefix;
        }

        XMLCh* enumPrefix;
        XMLCh* enumLocalName;
        XMLSize_t i=0;
        XMLSize_t enumLength = getEnumeration()->size();
        bool foundURIId = false;
        const XMLCh* normURI = 0;
		// The +=2 is because the enumeration has prefix:localname as one entry followed
		// by the URI string for the prefix as the next entry.
        for ( ; i < enumLength; i+=2)
        {            
            enumPrefix = XMLString::replicate(getEnumeration()->elementAt(i), manager);
            ArrayJanitor<XMLCh>  janEnum(enumPrefix, manager);
            colonPos = XMLString::indexOf(enumPrefix, chColon, 0, manager);
            
            if (colonPos != -1) {
                enumLocalName = enumPrefix + colonPos + 1;
                enumPrefix[colonPos] = chNull;
            }
            else {
                enumLocalName = enumPrefix;
            }
            
            if (XMLString::equals(localName, enumLocalName)) {               
				if (colonPos < 0)
					break;

                // now need to see if the prefix URI's are the same                
                if (!foundURIId) {                    
                    normURI = context->getURIForPrefix(prefix);                                       
                    foundURIId = true;
                }
				if (XMLString::equals(normURI, getEnumeration()->elementAt(i+1)))
					break;
            }        
        }

        if (i == enumLength)
            ThrowXMLwithMemMgr1(InvalidDatatypeValueException, XMLExcepts::VALUE_NotIn_Enumeration, content, manager);
    }
#endif

    checkAdditionalFacet(content, manager);
}